

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O1

void SUNDlsMat_AddIdentity(SUNDlsMat A)

{
  long lVar1;
  sunrealtype **ppsVar2;
  long lVar3;
  long lVar4;
  
  if (A->type == 1) {
    lVar1 = A->N;
    if (0 < lVar1) {
      ppsVar2 = A->cols;
      lVar3 = 0;
      do {
        ppsVar2[lVar3][lVar3] = ppsVar2[lVar3][lVar3] + 1.0;
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
    }
  }
  else if ((A->type == 2) && (lVar1 = A->M, 0 < lVar1)) {
    lVar3 = A->s_mu;
    ppsVar2 = A->cols;
    lVar4 = 0;
    do {
      ppsVar2[lVar4][lVar3] = ppsVar2[lVar4][lVar3] + 1.0;
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  return;
}

Assistant:

void SUNDlsMat_AddIdentity(SUNDlsMat A)
{
  sunindextype i;

  switch (A->type)
  {
  case SUNDIALS_DENSE:
    for (i = 0; i < A->N; i++) { A->cols[i][i] += ONE; }
    break;

  case SUNDIALS_BAND:
    for (i = 0; i < A->M; i++) { A->cols[i][A->s_mu] += ONE; }
    break;
  }
}